

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_dupset(SessionHandle *dst,SessionHandle *src)

{
  char *pcVar1;
  long lVar2;
  char **__s;
  
  memcpy(&dst->set,&src->set,0x500);
  __s = (dst->set).str;
  lVar2 = 0;
  memset(__s,0,0x140);
  do {
    pcVar1 = (src->set).str[lVar2];
    if (__s[lVar2] != (char *)0x0) {
      (*Curl_cfree)(__s[lVar2]);
      __s[lVar2] = (char *)0x0;
    }
    if (pcVar1 != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(pcVar1);
      if (pcVar1 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      __s[lVar2] = pcVar1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x28);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_dupset(struct SessionHandle *dst, struct SessionHandle *src)
{
  CURLcode r = CURLE_OK;
  enum dupstring i;

  /* Copy src->set into dst->set first, then deal with the strings
     afterwards */
  dst->set = src->set;

  /* clear all string pointers first */
  memset(dst->set.str, 0, STRING_LAST * sizeof(char *));

  /* duplicate all strings */
  for(i=(enum dupstring)0; i< STRING_LAST; i++) {
    r = setstropt(&dst->set.str[i], src->set.str[i]);
    if(r != CURLE_OK)
      break;
  }

  /* If a failure occurred, freeing has to be performed externally. */
  return r;
}